

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexStorageFullArrayCubeMipmapsError
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  stringstream *log;
  bool bVar1;
  GLuint depth;
  GLenum GVar2;
  char *funcName;
  GLboolean fullArrayCubeMipmaps;
  GLuint texture;
  GLint pageSizeY;
  GLint pageSizeZ;
  GLint pageSizeX;
  GLboolean local_4d;
  GLuint local_4c;
  int local_48;
  GLuint local_44;
  ulong local_40;
  GLint local_38;
  uint local_34;
  
  log = &this->mLog;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Verify FullArrayCubeMipmaps errors - ",0x25);
  depth = SparseTextureUtils::getTargetDepth(target);
  (*gl->getBooleanv)(0x91a9,&local_4d);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyQueryError(log,"getBooleanv",target,0x91a9,GVar2,0);
  if (!bVar1) {
    return false;
  }
  if (local_4d != '\0') {
    return true;
  }
  if (target < 0x8c1a) {
    if ((target != 0x8513) && (target != 0x8c18)) goto LAB_00a6056c;
LAB_00a60487:
    gl4cts::Texture::Generate(gl,&local_4c);
    (*gl->bindTexture)(target,local_4c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xb5);
    if (target == 0x8c18) {
      (*gl->texStorage2D)(0x8c18,1,format,8,0);
    }
    else {
      gl4cts::Texture::Storage(gl,target,1,format,8,8,depth);
    }
    GVar2 = (*gl->getError)();
    funcName = "TexStorage [case 3]";
  }
  else {
    if ((target == 0x8c1a) || (target == 0x9009)) goto LAB_00a60487;
LAB_00a6056c:
    gl4cts::Texture::Generate(gl,&local_4c);
    (*gl->bindTexture)(target,local_4c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xb5);
    (*gl->texParameteri)(target,0x91a6,1);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyQueryError(log,"texParameteri",target,0x91a6,GVar2,0);
    if (!bVar1) {
      return false;
    }
    gl4cts::Texture::Storage(gl,target,1,format,8,8,depth);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError(log,"TexStorage [sparse texture]",GVar2,0x502);
    if (!bVar1) {
      (*gl->deleteTextures)(1,&local_4c);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"GenTextures",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0xd4);
      return false;
    }
    gl4cts::Texture::Generate(gl,&local_4c);
    (*gl->bindTexture)(target,local_4c);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xb5);
    SparseTextureUtils::getTexturePageSizes(gl,target,format,(GLint *)&local_34,&local_48,&local_38)
    ;
    local_40 = (ulong)local_34;
    local_44 = local_48 << 3;
    gl4cts::Texture::Storage(gl,target,4,format,local_34 * 9,local_44,depth);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError(log,"TexStorage [wrong width]",GVar2,0x502);
    if (!bVar1) goto LAB_00a6052a;
    gl4cts::Texture::Storage(gl,target,4,format,(int)local_40 << 3,local_44 + local_48,depth);
    GVar2 = (*gl->getError)();
    funcName = "TexStorage [wrong height]";
  }
  bVar1 = SparseTextureUtils::verifyError(log,funcName,GVar2,0x502);
LAB_00a6052a:
  (*gl->deleteTextures)(1,&local_4c);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xd4);
  return bVar1;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexStorageFullArrayCubeMipmapsError(const Functions& gl, GLint target,
																				GLint format)
{
	mLog << "Verify FullArrayCubeMipmaps errors - ";

	bool result = true;

	GLuint texture;
	GLint  depth;

	depth = SparseTextureUtils::getTargetDepth(target);

	GLboolean fullArrayCubeMipmaps;

	gl.getBooleanv(GL_SPARSE_TEXTURE_FULL_ARRAY_CUBE_MIPMAPS_ARB, &fullArrayCubeMipmaps);
	if (!SparseTextureUtils::verifyQueryError(
			mLog, "getBooleanv", target, GL_SPARSE_TEXTURE_FULL_ARRAY_CUBE_MIPMAPS_ARB, gl.getError(), GL_NO_ERROR))
		return false;

	if (fullArrayCubeMipmaps == GL_FALSE)
	{
		if (target != GL_TEXTURE_1D_ARRAY && target != GL_TEXTURE_2D_ARRAY && target != GL_TEXTURE_CUBE_MAP &&
			target != GL_TEXTURE_CUBE_MAP_ARRAY)
		{
			// Case 1: test GL_TEXTURE_SPARSE_ARB
			Texture::Generate(gl, texture);
			Texture::Bind(gl, texture, target);

			gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
			if (!SparseTextureUtils::verifyQueryError(mLog, "texParameteri", target, GL_TEXTURE_SPARSE_ARB,
													  gl.getError(), GL_NO_ERROR))
				return false;

			Texture::Storage(gl, target, 1, format, 8, 8, depth);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [sparse texture]", gl.getError(),
												 GL_INVALID_OPERATION))
			{
				Texture::Delete(gl, texture);
				return false;
			}

			// Case 2: test wrong texture size
			Texture::Generate(gl, texture);
			Texture::Bind(gl, texture, target);

			GLint pageSizeX;
			GLint pageSizeY;
			GLint pageSizeZ;
			SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

			GLint levels = 4;
			GLint width  = pageSizeX * (int)pow(2, levels - 1);
			GLint height = pageSizeY * (int)pow(2, levels - 1);

			// Check 2 different cases:
			// 1) wrong width
			// 2) wrong height
			Texture::Storage(gl, target, levels, format, width + pageSizeX, height, depth);
			result =
				SparseTextureUtils::verifyError(mLog, "TexStorage [wrong width]", gl.getError(), GL_INVALID_OPERATION);

			if (result)
			{
				Texture::Storage(gl, target, levels, format, width, height + pageSizeY, depth);
				result = SparseTextureUtils::verifyError(mLog, "TexStorage [wrong height]", gl.getError(),
														 GL_INVALID_OPERATION);
			}

			Texture::Delete(gl, texture);
		}
		else
		{
			// Case 3: test full array mipmaps targets
			Texture::Generate(gl, texture);
			Texture::Bind(gl, texture, target);

			if (target == GL_TEXTURE_1D_ARRAY)
				Texture::Storage(gl, target, 1, format, 8, depth, 0);
			else
				Texture::Storage(gl, target, 1, format, 8, 8, depth);

			result = SparseTextureUtils::verifyError(mLog, "TexStorage [case 3]", gl.getError(), GL_INVALID_OPERATION);

			Texture::Delete(gl, texture);
		}
	}

	return result;
}